

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_OwnWindPair_TestShell::~TEST_MinipointCounterTest_OwnWindPair_TestShell
          (TEST_MinipointCounterTest_OwnWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_OwnWindPair_TestShell *mem;
  TEST_MinipointCounterTest_OwnWindPair_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_OwnWindPair_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, OwnWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::SouthWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}